

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Execute(ClientContext *this,shared_ptr<duckdb::Relation,_true> *relation)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t __n;
  pointer pcVar4;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var5;
  bool bVar6;
  int iVar7;
  Relation *pRVar8;
  undefined4 extraout_var;
  shared_ptr<duckdb::Relation,_true> *relation_00;
  pointer pPVar9;
  type lock_00;
  pointer pQVar10;
  reference pvVar11;
  const_reference pvVar12;
  LogicalType *pLVar13;
  reference pvVar14;
  string *psVar15;
  long *plVar16;
  shared_ptr<duckdb::Relation,_true> *in_RDX;
  idx_t i;
  ulong uVar17;
  size_type __n_00;
  pointer *__ptr;
  _Alloc_hider _Var18;
  undefined8 uVar19;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
  pending;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string err_str;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_1d8;
  string local_1d0;
  undefined1 local_1b0 [16];
  element_type *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_188;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_180;
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [32];
  __node_base *local_128 [2];
  __node_base local_118 [2];
  char *local_108 [2];
  char local_f8 [16];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  __buckets_ptr local_c8;
  size_t sStack_c0;
  __node_base local_b8;
  undefined1 local_b0 [128];
  vector<duckdb::ColumnDefinition,_true> *this_00;
  
  LockContext((ClientContext *)local_148);
  pRVar8 = shared_ptr<duckdb::Relation,_true>::operator->(in_RDX);
  iVar7 = (*pRVar8->_vptr_Relation[2])(pRVar8);
  this_00 = (vector<duckdb::ColumnDefinition,_true> *)CONCAT44(extraout_var,iVar7);
  relation_00 = (shared_ptr<duckdb::Relation,_true> *)
                unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                             *)local_148);
  PendingQueryInternal
            ((ClientContext *)local_1b0,(ClientContextLock *)relation,relation_00,SUB81(in_RDX,0));
  pPVar9 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_1b0);
  if ((pPVar9->super_BaseQueryResult).success == false) {
    pPVar9 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_1b0);
    local_148[0x18] = (pPVar9->super_BaseQueryResult).error.initialized;
    local_148[0x19] = (pPVar9->super_BaseQueryResult).error.type;
    pcVar4 = (pPVar9->super_BaseQueryResult).error.raw_message._M_dataplus._M_p;
    local_128[0] = local_118;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar4,
               pcVar4 + (pPVar9->super_BaseQueryResult).error.raw_message._M_string_length);
    pcVar4 = (pPVar9->super_BaseQueryResult).error.final_message._M_dataplus._M_p;
    local_108[0] = local_f8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,pcVar4,
               pcVar4 + (pPVar9->super_BaseQueryResult).error.final_message._M_string_length);
    local_e8._M_p = (pointer)0x0;
    local_e0 = (pPVar9->super_BaseQueryResult).error.extra_info._M_h._M_bucket_count;
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ = (pPVar9->super_BaseQueryResult).error.extra_info._M_h._M_element_count;
    local_c8 = *(__buckets_ptr *)
                &(pPVar9->super_BaseQueryResult).error.extra_info._M_h._M_rehash_policy;
    sStack_c0 = (pPVar9->super_BaseQueryResult).error.extra_info._M_h._M_rehash_policy.
                _M_next_resize;
    local_b8._M_nxt = (_Hash_node_base *)0x0;
    local_168._M_allocated_capacity =
         (size_type)
         (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          *)&local_e8;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_e8,&(pPVar9->super_BaseQueryResult).error.extra_info._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)&local_168._M_allocated_capacity);
    local_168._8_8_ = 0;
    local_158._M_local_buf[0] = false;
    local_168._M_allocated_capacity = (size_type)&local_158;
    ProcessError((ClientContext *)relation,(ErrorData *)(local_148 + 0x18),(string *)&local_168);
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
              ((duckdb *)&local_1d0,(ErrorData *)(local_148 + 0x18));
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1d0._M_dataplus._M_p;
    local_1d0._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_allocated_capacity != &local_158) {
      operator_delete((void *)local_168._M_allocated_capacity);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_e8);
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0]);
    }
    if (local_128[0] != local_118) {
      operator_delete(local_128[0]);
    }
    goto LAB_01676bb7;
  }
  local_1d8._M_head_impl = (QueryResult *)0x0;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
  operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
             *)local_148);
  lock_00 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
            ::operator*((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_1b0);
  PendingQueryResult::ExecuteInternal((PendingQueryResult *)&local_168,(ClientContextLock *)lock_00)
  ;
  uVar19 = local_168._M_allocated_capacity;
  _Var5._M_head_impl = local_1d8._M_head_impl;
  local_168._M_allocated_capacity = 0;
  local_1d8._M_head_impl = (QueryResult *)uVar19;
  if (_Var5._M_head_impl != (QueryResult *)0x0) {
    (*((_Var5._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*local_168._M_allocated_capacity + 8))();
  }
  pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
            operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_1d8);
  if ((pQVar10->super_BaseQueryResult).success == false) {
LAB_01676719:
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1d8._M_head_impl;
    local_1d8._M_head_impl = (QueryResult *)0x0;
  }
  else {
    pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
              operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)&local_1d8);
    if (((long)(pQVar10->super_BaseQueryResult).types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(pQVar10->super_BaseQueryResult).types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        ((long)(this_00->
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this_00->
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x7b425ed097b425ed == 0) {
      for (uVar17 = 0;
          pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                    ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                                  *)&local_1d8),
          uVar17 < (ulong)(((long)(pQVar10->super_BaseQueryResult).types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pQVar10->super_BaseQueryResult).types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555); uVar17 = uVar17 + 1) {
        pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                              *)&local_1d8);
        pvVar11 = vector<duckdb::LogicalType,_true>::operator[]
                            (&(pQVar10->super_BaseQueryResult).types,uVar17);
        pvVar12 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,uVar17);
        pLVar13 = ColumnDefinition::Type(pvVar12);
        bVar6 = LogicalType::operator==(pvVar11,pLVar13);
        if (!bVar6) goto LAB_0167672e;
        pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                              *)&local_1d8);
        pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&(pQVar10->super_BaseQueryResult).names,uVar17);
        pvVar12 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,uVar17);
        psVar15 = ColumnDefinition::Name_abi_cxx11_(pvVar12);
        __n = pvVar14->_M_string_length;
        if ((__n != psVar15->_M_string_length) ||
           ((__n != 0 &&
            (iVar7 = bcmp((pvVar14->_M_dataplus)._M_p,(psVar15->_M_dataplus)._M_p,__n), iVar7 != 0))
           )) goto LAB_0167672e;
      }
      goto LAB_01676719;
    }
LAB_0167672e:
    local_168._M_allocated_capacity = (size_type)&local_158;
    local_148._8_8_ = relation;
    local_148._16_8_ = this;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Result mismatch in query!\nExpected the following columns: [",
               "");
    if ((this_00->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
        .super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this_00->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
        .super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      __n_00 = 0;
      do {
        if (__n_00 != 0) {
          ::std::__cxx11::string::append(local_168._M_local_buf);
        }
        pvVar12 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,__n_00);
        psVar15 = ColumnDefinition::Name_abi_cxx11_(pvVar12);
        pcVar4 = (psVar15->_M_dataplus)._M_p;
        local_188._M_head_impl = (RegisteredStateManager *)&local_178;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,pcVar4,pcVar4 + psVar15->_M_string_length);
        ::std::__cxx11::string::append((char *)&local_188);
        pvVar12 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,__n_00);
        pLVar13 = ColumnDefinition::Type(pvVar12);
        LogicalType::ToString_abi_cxx11_((string *)(local_1b0 + 8),pLVar13);
        _Var18._M_p = (pointer)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if (local_188._M_head_impl != (RegisteredStateManager *)&local_178) {
          _Var18._M_p = local_178._M_p;
        }
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(local_1a0->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                         __weak_this_.internal.
                         super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + (long)local_180._M_head_impl);
        if (_Var18._M_p < p_Var2) {
          uVar19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._8_8_ != &local_198) {
            uVar19 = local_198._M_allocated_capacity;
          }
          if ((ulong)uVar19 < p_Var2) goto LAB_01676834;
          plVar16 = (long *)::std::__cxx11::string::replace
                                      ((ulong)(local_1b0 + 8),0,(char *)0x0,
                                       (ulong)local_188._M_head_impl);
        }
        else {
LAB_01676834:
          plVar16 = (long *)::std::__cxx11::string::_M_append((char *)&local_188,local_1b0._8_8_);
        }
        peVar1 = (element_type *)(plVar16 + 2);
        if ((element_type *)*plVar16 == peVar1) {
          local_1d0.field_2._M_allocated_capacity =
               *(undefined8 *)
                &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
          local_1d0.field_2._8_8_ = plVar16[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity =
               *(undefined8 *)
                &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
          local_1d0._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_1d0._M_string_length = plVar16[1];
        *plVar16 = (long)peVar1;
        plVar16[1] = 0;
        *(undefined1 *)&(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_
             = 0;
        ::std::__cxx11::string::_M_append(local_168._M_local_buf,(ulong)local_1d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._8_8_ != &local_198) {
          operator_delete((void *)local_1b0._8_8_);
        }
        if (local_188._M_head_impl != (RegisteredStateManager *)&local_178) {
          operator_delete(local_188._M_head_impl);
        }
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)(((long)(this_00->
                                       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                       ).
                                       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_00->
                                       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                       ).
                                       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x7b425ed097b425ed));
    }
    ::std::__cxx11::string::append(local_168._M_local_buf);
    paVar3 = &local_1d0.field_2;
    for (uVar17 = 0;
        pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                              *)&local_1d8),
        uVar17 < (ulong)(((long)(pQVar10->super_BaseQueryResult).types.
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pQVar10->super_BaseQueryResult).types.
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555); uVar17 = uVar17 + 1) {
      ::std::__cxx11::string::append(local_168._M_local_buf);
      pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                            *)&local_1d8);
      pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&(pQVar10->super_BaseQueryResult).names,uVar17);
      pcVar4 = (pvVar14->_M_dataplus)._M_p;
      local_188._M_head_impl = (RegisteredStateManager *)&local_178;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar4,pcVar4 + pvVar14->_M_string_length);
      ::std::__cxx11::string::append((char *)&local_188);
      pQVar10 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
                operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                            *)&local_1d8);
      pvVar11 = vector<duckdb::LogicalType,_true>::operator[]
                          (&(pQVar10->super_BaseQueryResult).types,uVar17);
      LogicalType::ToString_abi_cxx11_((string *)(local_1b0 + 8),pvVar11);
      _Var18._M_p = (pointer)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      if (local_188._M_head_impl != (RegisteredStateManager *)&local_178) {
        _Var18._M_p = local_178._M_p;
      }
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_1a0->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                       __weak_this_.internal.
                       super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + (long)local_180._M_head_impl);
      if (_Var18._M_p < p_Var2) {
        uVar19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._8_8_ != &local_198) {
          uVar19 = local_198._M_allocated_capacity;
        }
        if ((ulong)uVar19 < p_Var2) goto LAB_01676a1f;
        plVar16 = (long *)::std::__cxx11::string::replace
                                    ((ulong)(local_1b0 + 8),0,(char *)0x0,
                                     (ulong)local_188._M_head_impl);
      }
      else {
LAB_01676a1f:
        plVar16 = (long *)::std::__cxx11::string::_M_append((char *)&local_188,local_1b0._8_8_);
      }
      peVar1 = (element_type *)(plVar16 + 2);
      if ((element_type *)*plVar16 == peVar1) {
        local_1d0.field_2._M_allocated_capacity =
             *(undefined8 *)
              &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
        local_1d0.field_2._8_8_ = plVar16[3];
        local_1d0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1d0.field_2._M_allocated_capacity =
             *(undefined8 *)
              &(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_;
        local_1d0._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_1d0._M_string_length = plVar16[1];
      *plVar16 = (long)peVar1;
      plVar16[1] = 0;
      *(undefined1 *)&(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ =
           0;
      ::std::__cxx11::string::_M_append(local_168._M_local_buf,(ulong)local_1d0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._8_8_ != &local_198) {
        operator_delete((void *)local_1b0._8_8_);
      }
      if (local_188._M_head_impl != (RegisteredStateManager *)&local_178) {
        operator_delete(local_188._M_head_impl);
      }
    }
    ::std::__cxx11::string::append(local_168._M_local_buf);
    ErrorData::ErrorData((ErrorData *)local_b0,(string *)&local_168);
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_allocated_capacity =
         local_1d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1d0._M_dataplus._M_p = (pointer)paVar3;
    ProcessError((ClientContext *)local_148._8_8_,(ErrorData *)local_b0,&local_1d0);
    this = (ClientContext *)local_148._16_8_;
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
              ((duckdb *)&local_188,(ErrorData *)local_b0);
    *(RegisteredStateManager **)this = local_188._M_head_impl;
    local_188._M_head_impl = (RegisteredStateManager *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
      operator_delete((void *)local_b0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_allocated_capacity != &local_158) {
      operator_delete((void *)local_168._M_allocated_capacity);
    }
  }
  if ((element_type *)local_1d8._M_head_impl != (element_type *)0x0) {
    (**(code **)(*(long *)&(((weak_ptr<duckdb::ClientContext,_true> *)
                            &((local_1d8._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult
                            )->internal).
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> + 8))
              ();
  }
LAB_01676bb7:
  if ((tuple<duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>)
      local_1b0._0_8_ != (_Head_base<0UL,_duckdb::PendingQueryResult_*,_false>)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_1b0._0_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
               *)local_148);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (_Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Execute(const shared_ptr<Relation> &relation) {
	auto lock = LockContext();
	auto &expected_columns = relation->Columns();
	auto pending = PendingQueryInternal(*lock, relation, false);
	if (!pending->success) {
		return ErrorResult<MaterializedQueryResult>(pending->GetErrorObject());
	}

	unique_ptr<QueryResult> result;
	result = ExecutePendingQueryInternal(*lock, *pending);
	if (result->HasError()) {
		return result;
	}
	// verify that the result types and result names of the query match the expected result types/names
	if (result->types.size() == expected_columns.size()) {
		bool mismatch = false;
		for (idx_t i = 0; i < result->types.size(); i++) {
			if (result->types[i] != expected_columns[i].Type() || result->names[i] != expected_columns[i].Name()) {
				mismatch = true;
				break;
			}
		}
		if (!mismatch) {
			// all is as expected: return the result
			return result;
		}
	}
	// result mismatch
	string err_str = "Result mismatch in query!\nExpected the following columns: [";
	for (idx_t i = 0; i < expected_columns.size(); i++) {
		if (i > 0) {
			err_str += ", ";
		}
		err_str += expected_columns[i].Name() + " " + expected_columns[i].Type().ToString();
	}
	err_str += "]\nBut result contained the following: ";
	for (idx_t i = 0; i < result->types.size(); i++) {
		err_str += i == 0 ? "[" : ", ";
		err_str += result->names[i] + " " + result->types[i].ToString();
	}
	err_str += "]";
	return ErrorResult<MaterializedQueryResult>(ErrorData(err_str));
}